

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

uint64_t mse_8xh_16bit_avx2(uint8_t *dst,int dstride,uint16_t *src,int sstride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  uint in_ECX;
  ulong in_RDX;
  ulong uVar9;
  longlong in_RSI;
  long in_RDI;
  int in_R8D;
  __m128i v;
  __m128i sum_1x64;
  int i;
  __m256i square_result;
  __m256i zeros;
  __m256i sub_result;
  __m256i res1_4x64;
  __m256i res0_4x64;
  __m256i dst_16x16;
  __m256i src_16x16;
  __m256i src1_8x16;
  __m256i src0_8x16;
  __m128i dst3_16x8;
  __m128i dst1_8x8;
  __m128i dst0_8x8;
  uint64_t sum;
  int local_4c4;
  undefined1 local_4c0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined1 auStack_430 [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  uint64_t local_368 [3];
  int local_34c;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  ulong local_2f0;
  undefined8 uStack_2e8;
  ulong *local_2d8;
  ulong local_2d0;
  undefined8 uStack_2c8;
  ulong *local_2b8;
  ulong local_2b0;
  undefined8 uStack_2a8;
  ulong local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 (*local_270) [16];
  undefined1 (*local_268) [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar8 = uStack_178;
  uVar7 = local_180;
  local_34c = (int)in_RSI;
  local_368[0] = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_190 = 0;
  uStack_188 = 0;
  local_180 = 0;
  uStack_178 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_4c0 = ZEXT1632(ZEXT816(0));
  local_4c4 = 0;
  uVar9 = in_RDX;
  while( true ) {
    if (in_R8D <= local_4c4) break;
    local_2b8 = (ulong *)(in_RDI + local_4c4 * local_34c);
    local_2d0 = *local_2b8;
    uStack_2c8 = 0;
    local_2d8 = (ulong *)(in_RDI + (local_4c4 + 1) * local_34c);
    local_2f0 = *local_2d8;
    uStack_2e8 = 0;
    uStack_298 = 0;
    uStack_2a8 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_2d0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_2f0;
    auVar1 = vpunpcklqdq_avx(auVar5,auVar1);
    local_3a0 = auVar1._0_8_;
    local_230 = local_3a0;
    uStack_398 = auVar1._8_8_;
    uStack_228 = uStack_398;
    auVar2 = vpmovzxbw_avx2(auVar1);
    local_268 = (undefined1 (*) [16])(in_RDX + (long)(int)(local_4c4 * in_ECX) * 2);
    local_280 = *(undefined8 *)*local_268;
    uStack_278 = *(undefined8 *)(*local_268 + 8);
    uVar9 = (ulong)in_ECX;
    local_270 = (undefined1 (*) [16])(in_RDX + (long)(int)((local_4c4 + 1) * in_ECX) * 2);
    local_290 = *(undefined8 *)*local_270;
    uStack_288 = *(undefined8 *)(*local_270 + 8);
    auVar4._16_8_ = local_2f0;
    auVar4._0_16_ = *local_268;
    auVar4._24_8_ = 0;
    auVar3._16_8_ = local_2f0;
    auVar3._0_16_ = *local_270;
    auVar3._24_8_ = 0;
    auVar3 = vperm2i128_avx2(auVar4,auVar3,0x20);
    local_400 = auVar3._0_8_;
    local_1c0 = local_400;
    uStack_3f8 = auVar3._8_8_;
    uStack_1b8 = uStack_3f8;
    uStack_3f0 = auVar3._16_8_;
    uStack_1b0 = uStack_3f0;
    uStack_3e8 = auVar3._24_8_;
    uStack_1a8 = uStack_3e8;
    local_420 = auVar2._0_8_;
    local_1e0 = local_420;
    uStack_418 = auVar2._8_8_;
    uStack_1d8 = uStack_418;
    uStack_410 = auVar2._16_8_;
    uStack_1d0 = uStack_410;
    uStack_408 = auVar2._24_8_;
    uStack_1c8 = uStack_408;
    local_160 = vpsubw_avx2(auVar3,auVar2);
    auVar2 = vpabsw_avx2(local_160);
    local_480 = auVar2._0_8_;
    local_200 = local_480;
    uStack_478 = auVar2._8_8_;
    uStack_1f8 = uStack_478;
    uStack_470 = auVar2._16_8_;
    uStack_1f0 = uStack_470;
    uStack_468 = auVar2._24_8_;
    uStack_1e8 = uStack_468;
    local_220 = local_480;
    uStack_218 = uStack_478;
    uStack_210 = uStack_470;
    uStack_208 = uStack_468;
    auVar2 = vpmaddwd_avx2(auVar2,auVar2);
    local_320 = local_4c0._0_8_;
    uStack_318 = local_4c0._8_8_;
    uStack_310 = local_4c0._16_8_;
    uStack_308 = local_4c0._24_8_;
    local_400 = auVar2._0_8_;
    local_340 = local_400;
    uStack_3f8 = auVar2._8_8_;
    uStack_338 = uStack_3f8;
    uStack_3f0 = auVar2._16_8_;
    uStack_330 = uStack_3f0;
    uStack_3e8 = auVar2._24_8_;
    uStack_328 = uStack_3e8;
    local_4c0 = vpaddd_avx2(local_4c0,auVar2);
    local_4c4 = local_4c4 + 2;
    local_2b0 = local_2f0;
    local_2a0 = local_2d0;
  }
  local_120 = local_4c0._0_8_;
  uStack_118 = local_4c0._8_8_;
  uStack_110 = local_4c0._16_8_;
  uStack_108 = local_4c0._24_8_;
  auVar2._8_8_ = uVar8;
  auVar2._0_8_ = uVar7;
  auVar2._16_8_ = uVar7;
  auVar2._24_8_ = uVar8;
  auVar3 = vpunpckldq_avx2(local_4c0,auVar2);
  local_e0 = local_4c0._0_8_;
  uStack_d8 = local_4c0._8_8_;
  uStack_d0 = local_4c0._16_8_;
  uStack_c8 = local_4c0._24_8_;
  auVar6._8_8_ = uVar8;
  auVar6._0_8_ = uVar7;
  auVar6._16_8_ = uVar7;
  auVar6._24_8_ = uVar8;
  auVar2 = vpunpckhdq_avx2(local_4c0,auVar6);
  local_440 = auVar3._0_8_;
  uStack_438 = auVar3._8_8_;
  auStack_430._0_8_ = auVar3._16_8_;
  auStack_430._8_8_ = auVar3._24_8_;
  local_460 = auVar2._0_8_;
  uStack_458 = auVar2._8_8_;
  uStack_450 = auVar2._16_8_;
  uStack_448 = auVar2._24_8_;
  local_a0 = local_440;
  uStack_98 = uStack_438;
  uStack_90 = auStack_430._0_8_;
  uStack_88 = auStack_430._8_8_;
  local_c0 = local_460;
  uStack_b8 = uStack_458;
  uStack_b0 = uStack_450;
  uStack_a8 = uStack_448;
  auVar2 = vpaddq_avx2(auVar3,auVar2);
  local_440 = auVar2._0_8_;
  uStack_438 = auVar2._8_8_;
  auStack_430._0_8_ = auVar2._16_8_;
  auStack_430._8_8_ = auVar2._24_8_;
  local_260 = local_440;
  uStack_258 = uStack_438;
  uStack_250 = auStack_430._0_8_;
  uStack_248 = auStack_430._8_8_;
  uStack_38 = auStack_430._8_8_;
  local_40 = auStack_430._0_8_;
  auStack_430 = auVar2._16_16_;
  local_60 = vpaddq_avx(auStack_430,local_50);
  local_70 = vpsrldq_avx(local_60,8);
  vpaddq_avx(local_60,local_70);
  v[1] = uVar9;
  v[0] = in_RSI;
  xx_storel_64(local_368,v);
  return local_368[0];
}

Assistant:

static uint64_t mse_8xh_16bit_avx2(uint8_t *dst, int dstride, uint16_t *src,
                                   int sstride, int h) {
  uint64_t sum = 0;
  __m128i dst0_8x8, dst1_8x8, dst3_16x8;
  __m256i src0_8x16, src1_8x16, src_16x16, dst_16x16;
  __m256i res0_4x64, res1_4x64;
  __m256i sub_result;
  const __m256i zeros = _mm256_broadcastsi128_si256(_mm_setzero_si128());
  __m256i square_result = _mm256_broadcastsi128_si256(_mm_setzero_si128());

  for (int i = 0; i < h; i += 2) {
    dst0_8x8 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 0) * dstride]));
    dst1_8x8 = _mm_loadl_epi64((__m128i const *)(&dst[(i + 1) * dstride]));
    dst3_16x8 = _mm_unpacklo_epi64(dst0_8x8, dst1_8x8);
    dst_16x16 = _mm256_cvtepu8_epi16(dst3_16x8);

    src0_8x16 =
        _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)&src[i * sstride]));
    src1_8x16 = _mm256_castsi128_si256(
        _mm_loadu_si128((__m128i *)&src[(i + 1) * sstride]));
    src_16x16 = _mm256_permute2x128_si256(src0_8x16, src1_8x16, 0x20);

    // r15 r14 r13 - - - r1 r0 - 16 bit
    sub_result = _mm256_abs_epi16(_mm256_sub_epi16(src_16x16, dst_16x16));

    // s7 s6 s5 s4 s3 s2 s1 s0 - 32bit
    src_16x16 = _mm256_madd_epi16(sub_result, sub_result);

    // accumulation of result
    square_result = _mm256_add_epi32(square_result, src_16x16);
  }

  // s5 s4 s1 s0  - 64bit
  res0_4x64 = _mm256_unpacklo_epi32(square_result, zeros);
  // s7 s6 s3 s2 - 64bit
  res1_4x64 = _mm256_unpackhi_epi32(square_result, zeros);
  // r3 r2 r1 r0 - 64bit
  res0_4x64 = _mm256_add_epi64(res0_4x64, res1_4x64);
  // r1+r3 r2+r0 - 64bit
  const __m128i sum_1x64 =
      _mm_add_epi64(_mm256_castsi256_si128(res0_4x64),
                    _mm256_extracti128_si256(res0_4x64, 1));
  xx_storel_64(&sum, _mm_add_epi64(sum_1x64, _mm_srli_si128(sum_1x64, 8)));
  return sum;
}